

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O1

string * __thiscall
spvtools::FriendlyNameMapper::Sanitize
          (string *__return_storage_ptr__,FriendlyNameMapper *this,string *suggested_name)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  string valid;
  long *local_50 [2];
  long local_40 [2];
  
  sVar1 = suggested_name->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"_","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ_0123456789",
               "");
    sVar1 = suggested_name->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (suggested_name->_M_dataplus)._M_p;
      sVar3 = 0;
      do {
        std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)pcVar2[sVar3]);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::Sanitize(const std::string& suggested_name) {
  if (suggested_name.empty()) return "_";
  // Otherwise, replace invalid characters by '_'.
  std::string result;
  std::string valid =
      "abcdefghijklmnopqrstuvwxyz"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "_0123456789";
  std::transform(suggested_name.begin(), suggested_name.end(),
                 std::back_inserter(result), [&valid](const char c) {
                   return (std::string::npos == valid.find(c)) ? '_' : c;
                 });
  return result;
}